

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O3

void datrie_match(datrie_dictionary_desc *datrie_dictionary,ucs4_t *word,size_t *match_pos,
                 size_t *id,size_t limit)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int k;
  ucs4_t uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = *word;
  if (uVar5 == 0) {
    sVar3 = 0;
    sVar4 = 0;
  }
  else {
    sVar2 = 0;
    sVar4 = 0;
    uVar8 = 1;
    while (iVar1 = datrie_dictionary->dat[sVar4].base, iVar1 != -1) {
      uVar6 = iVar1 + uVar5;
      sVar3 = sVar2;
      if (((((int)uVar6 < 0) || (datrie_dictionary->dat_item_count <= uVar6)) ||
          (uVar7 = (ulong)uVar6, sVar4 != (long)datrie_dictionary->dat[uVar7].parent)) ||
         (sVar3 = uVar8, sVar4 = uVar7, limit - 1 < uVar8)) goto LAB_00102a9e;
      sVar2 = sVar2 + 1;
      uVar5 = word[uVar8];
      uVar8 = uVar8 + 1;
      if (uVar5 == 0) goto LAB_00102a9e;
    }
    sVar3 = uVar8 - 1;
  }
LAB_00102a9e:
  if (match_pos != (size_t *)0x0) {
    *match_pos = sVar3;
  }
  if (id != (size_t *)0x0) {
    *id = sVar4;
  }
  return;
}

Assistant:

void datrie_match(const datrie_dictionary_desc * datrie_dictionary, const ucs4_t * word,
		size_t *match_pos, size_t *id, size_t limit)
{
	size_t i, p;
	for (i = 0,p = 0; word[p] && (limit == 0 || p < limit) &&
			datrie_dictionary->dat[i].base != DATRIE_UNUSED; p ++)
	{
		int k = encode_char(word[p]);
		int j = datrie_dictionary->dat[i].base + k;
		if (j < 0 || j >= datrie_dictionary->dat_item_count || datrie_dictionary->dat[j].parent != i)
			break;
		i = j;
	}
	if (match_pos)
		*match_pos = p;
	if (id)
		*id = i;
}